

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
nonsugar::detail::
copy_shared<nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>
          (detail *this,
          option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *t)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar2;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  
  puVar1 = (undefined8 *)operator_new(0x50);
  local_38._M_alloc = &__a2;
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00145ce8;
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 2),
             (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)t);
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)(puVar1 + 4),
                 (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&t->
                     super_option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 6),
             (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)
             &t->super_option_pair<GreetOption,_(GreetOption)2,_void>);
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)(puVar1 + 8),
                 (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&t->
                     super_option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  local_38._M_ptr = (pointer)0x0;
  *(undefined8 **)(this + 8) = puVar1;
  *(__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> **)this =
       (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 2);
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  sVar2.
  super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.
  super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar2.
           super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<T> copy_shared(T const &t)
{
    return std::make_shared<T>(t);
}